

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_self_test(int verbose)

{
  int iVar1;
  int iVar2;
  mbedtls_mpi K;
  size_t len;
  uchar rsa_plaintext [24];
  uchar rsa_decrypted [24];
  uchar sha1sum [20];
  mbedtls_rsa_context local_1f8;
  uchar rsa_ciphertext [128];
  
  mbedtls_mpi_init(&K);
  memset(&local_1f8,0,0x150);
  iVar1 = mbedtls_mpi_read_string
                    (&K,0x10,
                     "9292758453063D803DD603D5E777D7888ED1D5BF35786190FA2F23EBC0848AEADDA92CA6C3D80B32C4D109BE0F36D6AE7130B9CED7ACDF54CFC7555AC14EEBAB93A89813FBF3C4F8066D2D800F7C38A81AE31942917403FF4946B0A83D3D3E05EE57C6F5F5606FB5D4BC6CD34EE0801A5E94BB77B07507233A0BC7BAC8F90F79"
                    );
  if (((iVar1 == 0) &&
      (iVar1 = mbedtls_rsa_import(&local_1f8,&K,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                  (mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0), iVar1 == 0)) &&
     (iVar1 = mbedtls_mpi_read_string
                        (&K,0x10,
                         "C36D0EB7FCD285223CFB5AABA5BDA3D82C01CAD19EA484A87EA4377637E75500FCB2005C5C7DD6EC4AC023CDA285D796C3D9E75E1EFC42488BB4F1D13AC30A57"
                        ), iVar1 == 0)) {
    iVar2 = mbedtls_mpi_copy(&local_1f8.P,&K);
    iVar1 = iVar2 + -0x4080;
    if ((iVar1 == 0 || iVar2 == 0) &&
       (iVar1 = mbedtls_mpi_read_string
                          (&K,0x10,
                           "C000DF51A7C77AE8D7C7370C1FF55B69E211C2B9E5DB1ED0BF61D0D9899620F4910E4168387E3C30AA1E00C339A795088452DD96A9A5EA5D9DCA68DA636032AF"
                          ), iVar1 == 0)) {
      iVar2 = mbedtls_mpi_copy(&local_1f8.Q,&K);
      iVar1 = iVar2 + -0x4080;
      if ((iVar1 == 0 || iVar2 == 0) &&
         (iVar1 = mbedtls_mpi_read_string
                            (&K,0x10,
                             "24BF6185468786FDD303083D25E64EFC66CA472BC44D253102F8B4A9D3BFA75091386C0077937FE33FA3252D28855837AE1B484A8A9A45F7EE8C0C634F99E8CDDF79C5CE07EE72C7F123142198164234CABB724CF78B8173B9F880FC86322407AF1FEDFDDE2BEB674CA15F3E81A1521E071513A1E85B5DFA031F21ECAE91A34D"
                            ), iVar1 == 0)) {
        iVar2 = mbedtls_mpi_copy(&local_1f8.D,&K);
        iVar1 = iVar2 + -0x4080;
        if ((iVar1 == 0 || iVar2 == 0) &&
           (iVar1 = mbedtls_mpi_read_string(&K,0x10,"10001"), iVar1 == 0)) {
          iVar2 = mbedtls_mpi_copy(&local_1f8.E,&K);
          iVar1 = iVar2 + -0x4080;
          if ((iVar1 == 0 || iVar2 == 0) && (iVar1 = mbedtls_rsa_complete(&local_1f8), iVar1 == 0))
          {
            if (verbose != 0) {
              printf("  RSA key validation: ");
            }
            iVar1 = mbedtls_rsa_check_pubkey(&local_1f8);
            if ((iVar1 == 0) && (iVar1 = mbedtls_rsa_check_privkey(&local_1f8), iVar1 == 0)) {
              if (verbose != 0) {
                printf("passed\n  PKCS#1 encryption : ");
              }
              rsa_plaintext[0] = -0x56;
              rsa_plaintext[1] = -0x45;
              rsa_plaintext[2] = -0x34;
              rsa_plaintext[3] = '\x03';
              rsa_plaintext[4] = '\x02';
              rsa_plaintext[5] = '\x01';
              rsa_plaintext[6] = '\0';
              rsa_plaintext[7] = -1;
              rsa_plaintext[8] = -1;
              rsa_plaintext[9] = -1;
              rsa_plaintext[10] = -1;
              rsa_plaintext[0xb] = -1;
              rsa_plaintext[0xc] = '\x11';
              rsa_plaintext[0xd] = '\"';
              rsa_plaintext[0xe] = '3';
              rsa_plaintext[0xf] = '\n';
              rsa_plaintext[0x10] = '\v';
              rsa_plaintext[0x11] = '\f';
              rsa_plaintext[0x12] = 0xcc;
              rsa_plaintext[0x13] = 0xdd;
              rsa_plaintext[0x14] = 0xdd;
              rsa_plaintext[0x15] = 0xdd;
              rsa_plaintext[0x16] = 0xdd;
              rsa_plaintext[0x17] = 0xdd;
              iVar1 = mbedtls_rsa_pkcs1_encrypt
                                (&local_1f8,myrand,(void *)0x0,0,0x18,rsa_plaintext,rsa_ciphertext);
              if (iVar1 == 0) {
                if (verbose != 0) {
                  printf("passed\n  PKCS#1 decryption : ");
                }
                iVar1 = mbedtls_rsa_pkcs1_decrypt
                                  (&local_1f8,myrand,(void *)0x0,1,&len,rsa_ciphertext,rsa_decrypted
                                   ,0x18);
                if ((iVar1 == 0) && (iVar1 = bcmp(rsa_decrypted,rsa_plaintext,len), iVar1 == 0)) {
                  if (verbose != 0) {
                    puts("passed");
                    printf("  PKCS#1 data sign  : ");
                  }
                  iVar1 = mbedtls_sha1_ret(rsa_plaintext,0x18,sha1sum);
                  if (iVar1 != 0) {
                    if (verbose == 0) {
                      return 1;
                    }
                    puts("failed");
                    return 1;
                  }
                  iVar1 = mbedtls_rsa_pkcs1_sign
                                    (&local_1f8,myrand,(void *)0x0,1,MBEDTLS_MD_SHA1,0,sha1sum,
                                     rsa_ciphertext);
                  if (iVar1 == 0) {
                    if (verbose != 0) {
                      printf("passed\n  PKCS#1 sig. verify: ");
                    }
                    iVar1 = mbedtls_rsa_pkcs1_verify
                                      (&local_1f8,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                                       (void *)0x0,0,MBEDTLS_MD_SHA1,0,sha1sum,rsa_ciphertext);
                    if (iVar1 == 0) {
                      if (verbose != 0) {
                        puts("passed");
                        putchar(10);
                      }
                      iVar1 = 0;
                      goto LAB_0011fde1;
                    }
                  }
                }
              }
            }
            iVar1 = 1;
            if (verbose != 0) {
              puts("failed");
            }
          }
        }
      }
    }
  }
LAB_0011fde1:
  mbedtls_mpi_free(&K);
  mbedtls_rsa_free(&local_1f8);
  return iVar1;
}

Assistant:

int mbedtls_rsa_self_test( int verbose )
{
    int ret = 0;
#if defined(MBEDTLS_PKCS1_V15)
    size_t len;
    mbedtls_rsa_context rsa;
    unsigned char rsa_plaintext[PT_LEN];
    unsigned char rsa_decrypted[PT_LEN];
    unsigned char rsa_ciphertext[KEY_LEN];
#if defined(MBEDTLS_SHA1_C)
    unsigned char sha1sum[20];
#endif

    mbedtls_mpi K;

    mbedtls_mpi_init( &K );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_N  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, &K, NULL, NULL, NULL, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_P  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, NULL, &K, NULL, NULL, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_Q  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, NULL, NULL, &K, NULL, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_D  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, NULL, NULL, NULL, &K, NULL ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_read_string( &K, 16, RSA_E  ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_import( &rsa, NULL, NULL, NULL, NULL, &K ) );

    MBEDTLS_MPI_CHK( mbedtls_rsa_complete( &rsa ) );

    if( verbose != 0 )
        mbedtls_printf( "  RSA key validation: " );

    if( mbedtls_rsa_check_pubkey(  &rsa ) != 0 ||
        mbedtls_rsa_check_privkey( &rsa ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n  PKCS#1 encryption : " );

    memcpy( rsa_plaintext, RSA_PT, PT_LEN );

    if( mbedtls_rsa_pkcs1_encrypt( &rsa, myrand, NULL, MBEDTLS_RSA_PUBLIC,
                                   PT_LEN, rsa_plaintext,
                                   rsa_ciphertext ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n  PKCS#1 decryption : " );

    if( mbedtls_rsa_pkcs1_decrypt( &rsa, myrand, NULL, MBEDTLS_RSA_PRIVATE,
                                   &len, rsa_ciphertext, rsa_decrypted,
                                   sizeof(rsa_decrypted) ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( memcmp( rsa_decrypted, rsa_plaintext, len ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

#if defined(MBEDTLS_SHA1_C)
    if( verbose != 0 )
        mbedtls_printf( "  PKCS#1 data sign  : " );

    if( mbedtls_sha1_ret( rsa_plaintext, PT_LEN, sha1sum ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        return( 1 );
    }

    if( mbedtls_rsa_pkcs1_sign( &rsa, myrand, NULL,
                                MBEDTLS_RSA_PRIVATE, MBEDTLS_MD_SHA1, 0,
                                sha1sum, rsa_ciphertext ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n  PKCS#1 sig. verify: " );

    if( mbedtls_rsa_pkcs1_verify( &rsa, NULL, NULL,
                                  MBEDTLS_RSA_PUBLIC, MBEDTLS_MD_SHA1, 0,
                                  sha1sum, rsa_ciphertext ) != 0 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed\n" );

        ret = 1;
        goto cleanup;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );
#endif /* MBEDTLS_SHA1_C */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

cleanup:
    mbedtls_mpi_free( &K );
    mbedtls_rsa_free( &rsa );
#else /* MBEDTLS_PKCS1_V15 */
    ((void) verbose);
#endif /* MBEDTLS_PKCS1_V15 */
    return( ret );
}